

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htentry.cpp
# Opt level: O0

void __thiscall HotRingInstance::hrHead::reset_counter(hrHead *this)

{
  htEntry *phStack_18;
  bool active;
  size_t ptr;
  hrHead *this_local;
  
  phStack_18 = (htEntry *)((ulong)this->head & 0xffffffffffff);
  if (((ulong)this->head & 0x8000000000000000) != 0) {
    phStack_18 = (htEntry *)((ulong)phStack_18 | 0x8000000000000000);
  }
  this->head = phStack_18;
  return;
}

Assistant:

void hrHead::reset_counter(){
            size_t ptr = reinterpret_cast<size_t>(head);
            bool active = ptr & (1l << 63l);        
            ptr <<= 16;
            ptr >>= 16;
            if(active){
                ptr |= (1l << 63l);
            }
            head = reinterpret_cast<htEntry*>(ptr);
        }